

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O3

bool __thiscall
LoaderLogger::LogDebugUtilsMessage
          (LoaderLogger *this,XrDebugUtilsMessageSeverityFlagsEXT message_severity,
          XrDebugUtilsMessageTypeFlagsEXT message_type,
          XrDebugUtilsMessengerCallbackDataEXT *callback_data)

{
  pointer puVar1;
  LoaderLogRecorder *pLVar2;
  int iVar3;
  byte bVar4;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder;
  pointer puVar5;
  AugmentedCallbackData augmented_data;
  AugmentedCallbackData local_b8;
  
  local_b8.new_objects.
  super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.new_objects.
  super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.labels.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.new_objects.
  super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.labels.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.labels.super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  DebugUtilsData::WrapCallbackData(&this->data_,&local_b8,callback_data);
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  puVar5 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 == puVar1) {
    bVar4 = 0;
  }
  else {
    bVar4 = 0;
    do {
      pLVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>.
               _M_t.
               super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
               super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl;
      if (((pLVar2->_type == XR_LOADER_LOG_DEBUG_UTILS) &&
          (((uint)message_severity & 0x1111 & ~(uint)pLVar2->_message_severities) == 0)) &&
         (((uint)message_type & 7 & ~(uint)pLVar2->_message_types) == 0)) {
        iVar3 = (*pLVar2->_vptr_LoaderLogRecorder[7])
                          (pLVar2,message_severity,message_type,local_b8.exported_data);
        bVar4 = bVar4 | (byte)iVar3;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar1);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  if (local_b8.new_objects.
      super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.new_objects.
                    super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.new_objects.
                          super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.new_objects.
                          super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.labels.
      super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.labels.
                    super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.labels.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.labels.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool LoaderLogger::LogDebugUtilsMessage(XrDebugUtilsMessageSeverityFlagsEXT message_severity,
                                        XrDebugUtilsMessageTypeFlagsEXT message_type,
                                        const XrDebugUtilsMessengerCallbackDataEXT* callback_data) {
    bool exit_app = false;
    XrLoaderLogMessageSeverityFlags log_message_severity = DebugUtilsSeveritiesToLoaderLogMessageSeverities(message_severity);
    XrLoaderLogMessageTypeFlags log_message_type = DebugUtilsMessageTypesToLoaderLogMessageTypes(message_type);

    AugmentedCallbackData augmented_data;
    data_.WrapCallbackData(&augmented_data, callback_data);

    // Loop through the recorders
    std::shared_lock<std::shared_timed_mutex> lock(_mutex);
    for (std::unique_ptr<LoaderLogRecorder>& recorder : _recorders) {
        // Only send the message if it's a debug utils recorder and of the type the recorder cares about.
        if (recorder->Type() != XR_LOADER_LOG_DEBUG_UTILS ||
            (recorder->MessageSeverities() & log_message_severity) != log_message_severity ||
            (recorder->MessageTypes() & log_message_type) != log_message_type) {
            continue;
        }

        exit_app |= recorder->LogDebugUtilsMessage(message_severity, message_type, augmented_data.exported_data);
    }
    return exit_app;
}